

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O0

void cmsysProcess_SetTimeout(cmsysProcess *cp,double timeout)

{
  double timeout_local;
  cmsysProcess *cp_local;
  
  if (cp != (cmsysProcess *)0x0) {
    cp->Timeout = timeout;
    if (cp->Timeout <= 0.0 && cp->Timeout != 0.0) {
      cp->Timeout = 0.0;
    }
    (cp->TimeoutTime).tv_sec = -1;
  }
  return;
}

Assistant:

void kwsysProcess_SetTimeout(kwsysProcess* cp, double timeout)
{
  if (!cp) {
    return;
  }
  cp->Timeout = timeout;
  if (cp->Timeout < 0) {
    cp->Timeout = 0;
  }
  // Force recomputation of TimeoutTime.
  cp->TimeoutTime.tv_sec = -1;
}